

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint32 __thiscall Js::FunctionBody::GetEndNonTempLocalIndex(FunctionBody *this)

{
  undefined4 local_24;
  RegSlot firstTmpReg;
  FunctionBody *this_local;
  
  local_24 = GetFirstTmpRegister(this);
  if (local_24 == 0xffffffff) {
    local_24 = GetLocalsCount(this);
  }
  return local_24;
}

Assistant:

uint32
    FunctionBody::GetEndNonTempLocalIndex()
    {
        // It will give the index on which current non temp locals ends, which is a first temp reg.
        RegSlot firstTmpReg = GetFirstTmpRegister();
        return firstTmpReg != Constants::NoRegister ? firstTmpReg : GetLocalsCount();
    }